

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O3

void __thiscall IteratorTest::arithmeticOperatorsTest<false>(IteratorTest *this)

{
  pointer puVar1;
  pointer puVar2;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var3;
  Iterator<int,_false,_std::allocator<unsigned_long>_> *pIVar4;
  Iterator<int,_true,_std::allocator<unsigned_long>_> *pIVar5;
  runtime_error *prVar6;
  logic_error *plVar7;
  code *pcVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  undefined *puVar12;
  bool bVar13;
  Iterator<int,_false,_std::allocator<unsigned_long>_> it;
  View<int,_false,_std::allocator<unsigned_long>_> v;
  Iterator<int,_false,_std::allocator<unsigned_long>_> local_228;
  Iterator<int,_false,_std::allocator<unsigned_long>_> local_1f8;
  undefined1 local_1c8 [16];
  size_t *local_1b8;
  size_t local_1a0;
  size_t local_198;
  Iterator<int,_false,_std::allocator<unsigned_long>_> local_188;
  view_pointer local_158;
  int *piStack_150;
  ulong local_148;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_140;
  view_pointer local_128;
  int *piStack_120;
  ulong local_118;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_110;
  view_pointer local_f8;
  int *piStack_f0;
  ulong local_e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e0;
  view_pointer local_c8;
  int *piStack_c0;
  ulong local_b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b0;
  Iterator<int,_false,_std::allocator<unsigned_long>_> local_90;
  Iterator<int,_false,_std::allocator<unsigned_long>_> local_60;
  
  _Var3._M_current = (unsigned_long *)operator_new(8);
  *_Var3._M_current = 0x18;
  local_1c8._0_8_ = this;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_1c8 + 8),_Var3,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_228);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8);
  local_228.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_228.index_ = 0;
  local_228.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.view_ = (view_pointer)0x0;
  local_228.pointer_ = (pointer)0x0;
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::testInvariant(&local_228);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            (&local_1f8,(View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8,0);
  local_228.index_ = local_1f8.index_;
  local_228.view_ = local_1f8.view_;
  local_228.pointer_ = local_1f8.pointer_;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&local_228.coordinates_,&local_1f8.coordinates_);
  if (local_1f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  lVar10 = 0;
  do {
    if ((local_228.view_ == (view_pointer)0x0) ||
       (((local_228.view_)->geometry_).size_ <= local_228.index_)) {
      plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error((runtime_error *)plVar7,"Assertion failed.");
      pcVar8 = std::runtime_error::~runtime_error;
      puVar12 = &std::runtime_error::typeinfo;
LAB_001c621d:
      __cxa_throw(plVar7,puVar12,pcVar8);
    }
    if (*local_228.pointer_ != this->data_[lVar10]) {
      plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar7,"test failed.");
      pcVar8 = std::logic_error::~logic_error;
      puVar12 = &std::logic_error::typeinfo;
      goto LAB_001c621d;
    }
    local_1f8.view_ = (view_pointer)0x1;
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator+=
              (&local_228,(difference_type *)&local_1f8);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x18);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            (&local_1f8,(View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8,local_198);
  if (local_228.view_ == (view_pointer)0x0) {
    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar7,"Assertion failed.");
  }
  else {
    if (local_1f8.view_ == local_228.view_) {
      if (local_228.index_ != local_1f8.index_) {
        plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar7,"test failed.");
        pcVar8 = std::logic_error::~logic_error;
        puVar12 = &std::logic_error::typeinfo;
        goto LAB_001c699d;
      }
      if (local_1f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1f8.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1f8.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1f8.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pIVar4 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator--(&local_228);
      if ((pIVar4->view_ == (view_pointer)0x0) ||
         ((pIVar4->view_->geometry_).size_ <= pIVar4->index_)) {
        plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error((runtime_error *)plVar7,"Assertion failed.");
        pcVar8 = std::runtime_error::~runtime_error;
        puVar12 = &std::runtime_error::typeinfo;
LAB_001c69cf:
        __cxa_throw(plVar7,puVar12,pcVar8);
      }
      if (*pIVar4->pointer_ != 0x2e) {
        plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar7,"test failed.");
        pcVar8 = std::logic_error::~logic_error;
        puVar12 = &std::logic_error::typeinfo;
        goto LAB_001c69cf;
      }
      if (local_228.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_228.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      operator_delete(local_1b8,local_1a0 * 0x18);
      operator_delete(_Var3._M_current,8);
      _Var3._M_current = (unsigned_long *)operator_new(8);
      *_Var3._M_current = 0x18;
      local_1c8._0_8_ = this;
      andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
      Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((Geometry<std::allocator<unsigned_long>> *)(local_1c8 + 8),_Var3,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                 (allocator_type *)&local_228);
      andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1c8);
      local_228.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_228.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_228.index_ = 0;
      local_228.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_228.view_ = (view_pointer)0x0;
      local_228.pointer_ = (pointer)0x0;
      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_228);
      andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1c8);
      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1f8,
                 (View<int,_true,_std::allocator<unsigned_long>_> *)local_1c8,0);
      puVar2 = local_228.coordinates_.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      puVar1 = local_228.coordinates_.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_228.index_ = local_1f8.index_;
      local_228.view_ = local_1f8.view_;
      local_228.pointer_ = local_1f8.pointer_;
      local_228.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start =
           local_1f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_228.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_1f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_228.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_1f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_1f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (puVar1 != (pointer)0x0) {
        operator_delete(puVar1,(long)puVar2 - (long)puVar1);
        if (local_1f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1f8.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      lVar10 = 0;
      do {
        if ((local_228.view_ == (view_pointer)0x0) ||
           (((local_228.view_)->geometry_).size_ <= local_228.index_)) {
          plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar7,"Assertion failed.");
          pcVar8 = std::runtime_error::~runtime_error;
          puVar12 = &std::runtime_error::typeinfo;
LAB_001c624f:
          __cxa_throw(plVar7,puVar12,pcVar8);
        }
        if (*local_228.pointer_ != this->data_[lVar10]) {
          plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar7,"test failed.");
          pcVar8 = std::logic_error::~logic_error;
          puVar12 = &std::logic_error::typeinfo;
          goto LAB_001c624f;
        }
        local_1f8.view_ = (view_pointer)0x1;
        andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator+=
                  ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_228,
                   (difference_type *)&local_1f8);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x18);
      andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1c8);
      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1f8,
                 (View<int,_true,_std::allocator<unsigned_long>_> *)local_1c8,local_198);
      if (local_228.view_ == (view_pointer)0x0) {
        plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error((runtime_error *)plVar7,"Assertion failed.");
      }
      else {
        if (local_1f8.view_ == local_228.view_) {
          if (local_228.index_ != local_1f8.index_) {
            plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar7,"test failed.");
            pcVar8 = std::logic_error::~logic_error;
            puVar12 = &std::logic_error::typeinfo;
            goto LAB_001c6a4b;
          }
          if (local_1f8.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1f8.coordinates_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_1f8.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1f8.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          pIVar5 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                             ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_228);
          if ((pIVar5->view_ == (view_pointer)0x0) ||
             ((pIVar5->view_->geometry_).size_ <= pIVar5->index_)) {
            plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error((runtime_error *)plVar7,"Assertion failed.");
            pcVar8 = std::runtime_error::~runtime_error;
            puVar12 = &std::runtime_error::typeinfo;
LAB_001c6a7d:
            __cxa_throw(plVar7,puVar12,pcVar8);
          }
          if (*pIVar5->pointer_ != 0x2e) {
            plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar7,"test failed.");
            pcVar8 = std::logic_error::~logic_error;
            puVar12 = &std::logic_error::typeinfo;
            goto LAB_001c6a7d;
          }
          if (local_228.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_228.coordinates_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_228.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_228.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          operator_delete(local_1b8,local_1a0 * 0x18);
          operator_delete(_Var3._M_current,8);
          _Var3._M_current = (unsigned_long *)operator_new(8);
          *_Var3._M_current = 0x18;
          local_1c8._0_8_ = this;
          andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
          Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    ((Geometry<std::allocator<unsigned_long>> *)(local_1c8 + 8),_Var3,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                     (allocator_type *)&local_228);
          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8);
          local_228.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_228.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_228.index_ = 0;
          local_228.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_228.view_ = (view_pointer)0x0;
          local_228.pointer_ = (pointer)0x0;
          andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                    ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_228);
          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8);
          andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                    (&local_188,(View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8,0);
          local_1f8.view_ = local_188.view_;
          local_1f8.pointer_ = local_188.pointer_;
          local_1f8.index_ = local_188.index_;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_1f8.coordinates_,&local_188.coordinates_);
          andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                    ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1f8);
          puVar2 = local_228.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          puVar1 = local_228.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_228.index_ = local_1f8.index_;
          local_228.view_ = local_1f8.view_;
          local_228.pointer_ = local_1f8.pointer_;
          local_228.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start =
               local_1f8.coordinates_.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_228.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_1f8.coordinates_.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_228.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               local_1f8.coordinates_.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_1f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_1f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (puVar1 != (pointer)0x0) {
            operator_delete(puVar1,(long)puVar2 - (long)puVar1);
            if (local_1f8.coordinates_.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_1f8.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_1f8.coordinates_.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_1f8.coordinates_.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
          }
          if (local_188.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_188.coordinates_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_188.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_188.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          lVar10 = 0;
          do {
            if ((local_228.view_ == (view_pointer)0x0) ||
               (((local_228.view_)->geometry_).size_ <= local_228.index_)) {
              plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error((runtime_error *)plVar7,"Assertion failed.");
              pcVar8 = std::runtime_error::~runtime_error;
              puVar12 = &std::runtime_error::typeinfo;
LAB_001c6281:
              __cxa_throw(plVar7,puVar12,pcVar8);
            }
            if (*local_228.pointer_ != this->data_[lVar10]) {
              plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
              std::logic_error::logic_error(plVar7,"test failed.");
              pcVar8 = std::logic_error::~logic_error;
              puVar12 = &std::logic_error::typeinfo;
              goto LAB_001c6281;
            }
            local_1f8.view_ = (view_pointer)0x1;
            andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator+=
                      ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_228,
                       (difference_type *)&local_1f8);
            lVar10 = lVar10 + 1;
          } while (lVar10 != 0x18);
          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8);
          andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                    (&local_1f8,(View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8,
                     local_198);
          if (local_228.view_ == (view_pointer)0x0) {
            plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error((runtime_error *)plVar7,"Assertion failed.");
          }
          else {
            if (local_1f8.view_ == local_228.view_) {
              if (local_228.index_ != local_1f8.index_) {
                plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar7,"test failed.");
                pcVar8 = std::logic_error::~logic_error;
                puVar12 = &std::logic_error::typeinfo;
                goto LAB_001c6af9;
              }
              if (local_1f8.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_1f8.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_1f8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_1f8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              pIVar5 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                                 ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_228)
              ;
              if ((pIVar5->view_ == (view_pointer)0x0) ||
                 ((pIVar5->view_->geometry_).size_ <= pIVar5->index_)) {
                plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar7,"Assertion failed.");
                pcVar8 = std::runtime_error::~runtime_error;
                puVar12 = &std::runtime_error::typeinfo;
LAB_001c6b2b:
                __cxa_throw(plVar7,puVar12,pcVar8);
              }
              if (*pIVar5->pointer_ != 0x2e) {
                plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar7,"test failed.");
                pcVar8 = std::logic_error::~logic_error;
                puVar12 = &std::logic_error::typeinfo;
                goto LAB_001c6b2b;
              }
              if (local_228.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_228.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_228.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_228.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              operator_delete(local_1b8,local_1a0 * 0x18);
              operator_delete(_Var3._M_current,8);
              _Var3._M_current = (unsigned_long *)operator_new(8);
              *_Var3._M_current = 0x18;
              local_1c8._0_8_ = this;
              andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((Geometry<std::allocator<unsigned_long>> *)(local_1c8 + 8),_Var3,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                         (allocator_type *)&local_228);
              andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8);
              local_228.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_228.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_228.index_ = 0;
              local_228.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_228.view_ = (view_pointer)0x0;
              local_228.pointer_ = (pointer)0x0;
              andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                        (&local_228);
              andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8);
              andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                        (&local_1f8,(View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8,
                         local_198);
              local_228.index_ = local_1f8.index_;
              local_228.view_ = local_1f8.view_;
              local_228.pointer_ = local_1f8.pointer_;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                        (&local_228.coordinates_,&local_1f8.coordinates_);
              if (local_1f8.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_1f8.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_1f8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_1f8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              uVar11 = 0x17;
              do {
                local_1f8.view_ = (view_pointer)0x1;
                andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator-=
                          (&local_228,(difference_type *)&local_1f8);
                if ((local_228.view_ == (view_pointer)0x0) ||
                   (((local_228.view_)->geometry_).size_ <= local_228.index_)) {
                  plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error((runtime_error *)plVar7,"Assertion failed.");
                  pcVar8 = std::runtime_error::~runtime_error;
                  puVar12 = &std::runtime_error::typeinfo;
LAB_001c62b3:
                  __cxa_throw(plVar7,puVar12,pcVar8);
                }
                iVar9 = (int)uVar11;
                if (*local_228.pointer_ != this->data_[uVar11]) {
                  plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(plVar7,"test failed.");
                  pcVar8 = std::logic_error::~logic_error;
                  puVar12 = &std::logic_error::typeinfo;
                  goto LAB_001c62b3;
                }
                uVar11 = (ulong)(iVar9 - 1);
              } while (iVar9 != 0);
              andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8);
              andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                        (&local_1f8,(View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8,0)
              ;
              if (local_228.view_ == (view_pointer)0x0) {
                plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar7,"Assertion failed.");
              }
              else {
                if (local_1f8.view_ == local_228.view_) {
                  if (local_228.index_ != local_1f8.index_) {
                    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                    std::logic_error::logic_error(plVar7,"test failed.");
                    pcVar8 = std::logic_error::~logic_error;
                    puVar12 = &std::logic_error::typeinfo;
                    goto LAB_001c6ba7;
                  }
                  if (local_1f8.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start == (pointer)0x0) {
LAB_001c4128:
                    if (local_228.index_ < ((local_228.view_)->geometry_).size_) {
                      if (*local_228.pointer_ != 0) {
                        plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::logic_error::logic_error(plVar7,"test failed.");
                        pcVar8 = std::logic_error::~logic_error;
                        puVar12 = &std::logic_error::typeinfo;
                        goto LAB_001c6bd9;
                      }
                      if (local_228.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_228.coordinates_.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_228.coordinates_.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_228.coordinates_.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      operator_delete(local_1b8,local_1a0 * 0x18);
                      operator_delete(_Var3._M_current,8);
                      _Var3._M_current = (unsigned_long *)operator_new(8);
                      *_Var3._M_current = 0x18;
                      local_1c8._0_8_ = this;
                      andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                      Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                ((Geometry<std::allocator<unsigned_long>> *)(local_1c8 + 8),_Var3,
                                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  )(_Var3._M_current + 1),&andres::defaultOrder,
                                 &andres::defaultOrder,(allocator_type *)&local_228);
                      andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1c8);
                      local_228.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish = (pointer)0x0;
                      local_228.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      local_228.index_ = 0;
                      local_228.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start = (pointer)0x0;
                      local_228.view_ = (view_pointer)0x0;
                      local_228.pointer_ = (pointer)0x0;
                      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_228);
                      andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1c8);
                      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                                ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1f8,
                                 (View<int,_true,_std::allocator<unsigned_long>_> *)local_1c8,
                                 local_198);
                      puVar2 = local_228.coordinates_.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage;
                      puVar1 = local_228.coordinates_.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                      local_228.index_ = local_1f8.index_;
                      local_228.view_ = local_1f8.view_;
                      local_228.pointer_ = local_1f8.pointer_;
                      local_228.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start =
                           local_1f8.coordinates_.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start;
                      local_228.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           local_1f8.coordinates_.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish;
                      local_228.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage =
                           local_1f8.coordinates_.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage;
                      local_1f8.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start = (pointer)0x0;
                      local_1f8.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish = (pointer)0x0;
                      local_1f8.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      if (puVar1 != (pointer)0x0) {
                        operator_delete(puVar1,(long)puVar2 - (long)puVar1);
                        if (local_1f8.coordinates_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                          operator_delete(local_1f8.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)local_1f8.coordinates_.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_1f8.coordinates_.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                      }
                      uVar11 = 0x17;
                      do {
                        local_1f8.view_ = (view_pointer)0x1;
                        andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator-=
                                  ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_228
                                   ,(difference_type *)&local_1f8);
                        if ((local_228.view_ == (view_pointer)0x0) ||
                           (((local_228.view_)->geometry_).size_ <= local_228.index_)) {
                          plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error
                                    ((runtime_error *)plVar7,"Assertion failed.");
                          pcVar8 = std::runtime_error::~runtime_error;
                          puVar12 = &std::runtime_error::typeinfo;
LAB_001c62e5:
                          __cxa_throw(plVar7,puVar12,pcVar8);
                        }
                        iVar9 = (int)uVar11;
                        if (*local_228.pointer_ != this->data_[uVar11]) {
                          plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                          std::logic_error::logic_error(plVar7,"test failed.");
                          pcVar8 = std::logic_error::~logic_error;
                          puVar12 = &std::logic_error::typeinfo;
                          goto LAB_001c62e5;
                        }
                        uVar11 = (ulong)(iVar9 - 1);
                      } while (iVar9 != 0);
                      andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1c8);
                      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                                ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_1f8,
                                 (View<int,_true,_std::allocator<unsigned_long>_> *)local_1c8,0);
                      if (local_228.view_ == (view_pointer)0x0) {
                        plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error
                                  ((runtime_error *)plVar7,"Assertion failed.");
                      }
                      else {
                        if (local_1f8.view_ == local_228.view_) {
                          if (local_228.index_ != local_1f8.index_) {
                            plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::logic_error::logic_error(plVar7,"test failed.");
                            pcVar8 = std::logic_error::~logic_error;
                            puVar12 = &std::logic_error::typeinfo;
                            goto LAB_001c6c55;
                          }
                          if (local_1f8.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
LAB_001c4319:
                            if (local_228.index_ < ((local_228.view_)->geometry_).size_) {
                              if (*local_228.pointer_ != 0) {
                                plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                                std::logic_error::logic_error(plVar7,"test failed.");
                                pcVar8 = std::logic_error::~logic_error;
                                puVar12 = &std::logic_error::typeinfo;
                                goto LAB_001c6c87;
                              }
                              if (local_228.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                operator_delete(local_228.coordinates_.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                                (long)local_228.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                - (long)local_228.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                              }
                              operator_delete(local_1b8,local_1a0 * 0x18);
                              operator_delete(_Var3._M_current,8);
                              _Var3._M_current = (unsigned_long *)operator_new(8);
                              *_Var3._M_current = 0x18;
                              local_1c8._0_8_ = this;
                              andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                        ((Geometry<std::allocator<unsigned_long>> *)(local_1c8 + 8),
                                         _Var3,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                )(_Var3._M_current + 1),&andres::defaultOrder,
                                         &andres::defaultOrder,(allocator_type *)&local_228);
                              andres::View<int,_false,_std::allocator<unsigned_long>_>::
                              testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                            local_1c8);
                              local_228.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                              local_228.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                              local_228.index_ = 0;
                              local_228.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                              local_228.view_ = (view_pointer)0x0;
                              local_228.pointer_ = (pointer)0x0;
                              andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                              testInvariant((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
                                            &local_228);
                              andres::View<int,_false,_std::allocator<unsigned_long>_>::
                              testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                            local_1c8);
                              andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                                        (&local_188,
                                         (View<int,_false,_std::allocator<unsigned_long>_> *)
                                         local_1c8,local_198);
                              local_1f8.view_ = local_188.view_;
                              local_1f8.pointer_ = local_188.pointer_;
                              local_1f8.index_ = local_188.index_;
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                        (&local_1f8.coordinates_,&local_188.coordinates_);
                              andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                              testInvariant((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
                                            &local_1f8);
                              puVar2 = local_228.coordinates_.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                              puVar1 = local_228.coordinates_.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                              local_228.index_ = local_1f8.index_;
                              local_228.view_ = local_1f8.view_;
                              local_228.pointer_ = local_1f8.pointer_;
                              local_228.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start =
                                   local_1f8.coordinates_.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                              local_228.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish =
                                   local_1f8.coordinates_.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                              local_228.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage =
                                   local_1f8.coordinates_.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
                              local_1f8.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                              local_1f8.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                              local_1f8.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                              if (puVar1 != (pointer)0x0) {
                                operator_delete(puVar1,(long)puVar2 - (long)puVar1);
                                if (local_1f8.coordinates_.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                  operator_delete(local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                }
                              }
                              if (local_188.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                operator_delete(local_188.coordinates_.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                                (long)local_188.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                - (long)local_188.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                              }
                              uVar11 = 0x17;
                              do {
                                local_1f8.view_ = (view_pointer)0x1;
                                andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                operator-=((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
                                           &local_228,(difference_type *)&local_1f8);
                                if ((local_228.view_ == (view_pointer)0x0) ||
                                   (((local_228.view_)->geometry_).size_ <= local_228.index_)) {
                                  plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::runtime_error::runtime_error
                                            ((runtime_error *)plVar7,"Assertion failed.");
                                  pcVar8 = std::runtime_error::~runtime_error;
                                  puVar12 = &std::runtime_error::typeinfo;
LAB_001c6317:
                                  __cxa_throw(plVar7,puVar12,pcVar8);
                                }
                                iVar9 = (int)uVar11;
                                if (*local_228.pointer_ != this->data_[uVar11]) {
                                  plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::logic_error::logic_error(plVar7,"test failed.");
                                  pcVar8 = std::logic_error::~logic_error;
                                  puVar12 = &std::logic_error::typeinfo;
                                  goto LAB_001c6317;
                                }
                                uVar11 = (ulong)(iVar9 - 1);
                              } while (iVar9 != 0);
                              andres::View<int,_false,_std::allocator<unsigned_long>_>::
                              testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                            local_1c8);
                              andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                                        (&local_1f8,
                                         (View<int,_false,_std::allocator<unsigned_long>_> *)
                                         local_1c8,0);
                              if (local_228.view_ == (view_pointer)0x0) {
                                plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                                std::runtime_error::runtime_error
                                          ((runtime_error *)plVar7,"Assertion failed.");
                              }
                              else {
                                if (local_1f8.view_ == local_228.view_) {
                                  if (local_228.index_ != local_1f8.index_) {
                                    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::logic_error::logic_error(plVar7,"test failed.");
                                    pcVar8 = std::logic_error::~logic_error;
                                    puVar12 = &std::logic_error::typeinfo;
                                    goto LAB_001c6d03;
                                  }
                                  if (local_1f8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
LAB_001c4554:
                                    if (local_228.index_ < ((local_228.view_)->geometry_).size_) {
                                      if (*local_228.pointer_ != 0) {
                                        plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::logic_error::logic_error(plVar7,"test failed.");
                                        pcVar8 = std::logic_error::~logic_error;
                                        puVar12 = &std::logic_error::typeinfo;
                                        goto LAB_001c6d35;
                                      }
                                      if (local_228.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)
                                      {
                                        operator_delete(local_228.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_228.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_228.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                      }
                                      operator_delete(local_1b8,local_1a0 * 0x18);
                                      operator_delete(_Var3._M_current,8);
                                      _Var3._M_current = (unsigned_long *)operator_new(8);
                                      *_Var3._M_current = 0x18;
                                      local_1c8._0_8_ = this;
                                      andres::marray_detail::Geometry<std::allocator<unsigned_long>>
                                      ::
                                      Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                ((Geometry<std::allocator<unsigned_long>> *)
                                                 (local_1c8 + 8),_Var3,
                                                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var3._M_current + 1),&andres::defaultOrder,
                                                 &andres::defaultOrder,(allocator_type *)&local_228)
                                      ;
                                      andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                      testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8);
                                      local_228.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                                      local_228.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                           (pointer)0x0;
                                      local_228.index_ = 0;
                                      local_228.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                                      local_228.view_ = (view_pointer)0x0;
                                      local_228.pointer_ = (pointer)0x0;
                                      andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::
                                      testInvariant(&local_228);
                                      andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                      testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8);
                                      andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::
                                      Iterator(&local_1f8,
                                               (View<int,_false,_std::allocator<unsigned_long>_> *)
                                               local_1c8,0);
                                      local_228.index_ = local_1f8.index_;
                                      local_228.view_ = local_1f8.view_;
                                      local_228.pointer_ = local_1f8.pointer_;
                                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                      operator=(&local_228.coordinates_,&local_1f8.coordinates_);
                                      if (local_1f8.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)
                                      {
                                        operator_delete(local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                      }
                                      lVar10 = 0;
                                      do {
                                        if ((local_228.view_ == (view_pointer)0x0) ||
                                           (((local_228.view_)->geometry_).size_ <= local_228.index_
                                           )) {
                                          plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                                          std::runtime_error::runtime_error
                                                    ((runtime_error *)plVar7,"Assertion failed.");
                                          pcVar8 = std::runtime_error::~runtime_error;
                                          puVar12 = &std::runtime_error::typeinfo;
LAB_001c6349:
                                          __cxa_throw(plVar7,puVar12,pcVar8);
                                        }
                                        if (*local_228.pointer_ != this->data_[lVar10]) {
                                          plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                                          std::logic_error::logic_error(plVar7,"test failed.");
                                          pcVar8 = std::logic_error::~logic_error;
                                          puVar12 = &std::logic_error::typeinfo;
                                          goto LAB_001c6349;
                                        }
                                        andres::Iterator<int,_false,_std::allocator<unsigned_long>_>
                                        ::operator++(&local_228);
                                        lVar10 = lVar10 + 1;
                                      } while (lVar10 != 0x18);
                                      andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                      testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8);
                                      andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::
                                      Iterator(&local_1f8,
                                               (View<int,_false,_std::allocator<unsigned_long>_> *)
                                               local_1c8,local_198);
                                      if (local_228.view_ == (view_pointer)0x0) {
                                        plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::runtime_error::runtime_error
                                                  ((runtime_error *)plVar7,"Assertion failed.");
                                      }
                                      else {
                                        if (local_1f8.view_ == local_228.view_) {
                                          if (local_228.index_ != local_1f8.index_) {
                                            plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                                            std::logic_error::logic_error(plVar7,"test failed.");
                                            pcVar8 = std::logic_error::~logic_error;
                                            puVar12 = &std::logic_error::typeinfo;
                                            goto LAB_001c6db1;
                                          }
                                          if (local_1f8.coordinates_.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_start !=
                                              (pointer)0x0) {
                                            operator_delete(local_1f8.coordinates_.
                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                          }
                                          pIVar4 = andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_228);
                                          if ((pIVar4->view_ == (view_pointer)0x0) ||
                                             ((pIVar4->view_->geometry_).size_ <= pIVar4->index_)) {
                                            plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                                            std::runtime_error::runtime_error
                                                      ((runtime_error *)plVar7,"Assertion failed.");
                                            pcVar8 = std::runtime_error::~runtime_error;
                                            puVar12 = &std::runtime_error::typeinfo;
LAB_001c6de3:
                                            __cxa_throw(plVar7,puVar12,pcVar8);
                                          }
                                          if (*pIVar4->pointer_ != 0x2e) {
                                            plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                                            std::logic_error::logic_error(plVar7,"test failed.");
                                            pcVar8 = std::logic_error::~logic_error;
                                            puVar12 = &std::logic_error::typeinfo;
                                            goto LAB_001c6de3;
                                          }
                                          if (local_228.coordinates_.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_start !=
                                              (pointer)0x0) {
                                            operator_delete(local_228.coordinates_.
                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_228.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_228.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                          }
                                          operator_delete(local_1b8,local_1a0 * 0x18);
                                          operator_delete(_Var3._M_current,8);
                                          _Var3._M_current = (unsigned_long *)operator_new(8);
                                          *_Var3._M_current = 0x18;
                                          local_1c8._0_8_ = this;
                                          andres::marray_detail::
                                          Geometry<std::allocator<unsigned_long>>::
                                          Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                    ((Geometry<std::allocator<unsigned_long>> *)
                                                     (local_1c8 + 8),_Var3,
                                                     (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var3._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_228
                                                  );
                                          andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                          testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8);
                                          local_228.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                                          local_228.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                               (pointer)0x0;
                                          local_228.index_ = 0;
                                          local_228.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                                          local_228.view_ = (view_pointer)0x0;
                                          local_228.pointer_ = (pointer)0x0;
                                          andres::
                                          Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                          testInvariant((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_228);
                                          andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                          testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8);
                                          andres::
                                          Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                          Iterator((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_1f8,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_1c8,0);
                                          puVar2 = local_228.coordinates_.
                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          ;
                                          puVar1 = local_228.coordinates_.
                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                          local_228.index_ = local_1f8.index_;
                                          local_228.view_ = local_1f8.view_;
                                          local_228.pointer_ = local_1f8.pointer_;
                                          local_228.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start =
                                               local_1f8.coordinates_.
                                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               ._M_impl.super__Vector_impl_data._M_start;
                                          local_228.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_finish =
                                               local_1f8.coordinates_.
                                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               ._M_impl.super__Vector_impl_data._M_finish;
                                          local_228.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                               local_1f8.coordinates_.
                                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                          local_1f8.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                                          local_1f8.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                                          local_1f8.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                               (pointer)0x0;
                                          if (puVar1 != (pointer)0x0) {
                                            operator_delete(puVar1,(long)puVar2 - (long)puVar1);
                                            if (local_1f8.coordinates_.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_start !=
                                                (pointer)0x0) {
                                              operator_delete(local_1f8.coordinates_.
                                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                            }
                                          }
                                          lVar10 = 0;
                                          do {
                                            if ((local_228.view_ == (view_pointer)0x0) ||
                                               (((local_228.view_)->geometry_).size_ <=
                                                local_228.index_)) {
                                              plVar7 = (logic_error *)__cxa_allocate_exception(0x10)
                                              ;
                                              std::runtime_error::runtime_error
                                                        ((runtime_error *)plVar7,"Assertion failed."
                                                        );
                                              pcVar8 = std::runtime_error::~runtime_error;
                                              puVar12 = &std::runtime_error::typeinfo;
LAB_001c637b:
                                              __cxa_throw(plVar7,puVar12,pcVar8);
                                            }
                                            if (*local_228.pointer_ != this->data_[lVar10]) {
                                              plVar7 = (logic_error *)__cxa_allocate_exception(0x10)
                                              ;
                                              std::logic_error::logic_error(plVar7,"test failed.");
                                              pcVar8 = std::logic_error::~logic_error;
                                              puVar12 = &std::logic_error::typeinfo;
                                              goto LAB_001c637b;
                                            }
                                            andres::
                                            Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                            operator++((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_228);
                                            lVar10 = lVar10 + 1;
                                          } while (lVar10 != 0x18);
                                          andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                          testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8);
                                          andres::
                                          Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                          Iterator((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_1f8,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_1c8,local_198);
                                          if (local_228.view_ == (view_pointer)0x0) {
                                            plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                                            std::runtime_error::runtime_error
                                                      ((runtime_error *)plVar7,"Assertion failed.");
                                          }
                                          else {
                                            if (local_1f8.view_ == local_228.view_) {
                                              if (local_228.index_ != local_1f8.index_) {
                                                plVar7 = (logic_error *)
                                                         __cxa_allocate_exception(0x10);
                                                std::logic_error::logic_error(plVar7,"test failed.")
                                                ;
                                                pcVar8 = std::logic_error::~logic_error;
                                                puVar12 = &std::logic_error::typeinfo;
                                                goto LAB_001c6e5f;
                                              }
                                              if (local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                operator_delete(local_1f8.coordinates_.
                                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                              }
                                              pIVar5 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_228);
                                              if ((pIVar5->view_ == (view_pointer)0x0) ||
                                                 ((pIVar5->view_->geometry_).size_ <= pIVar5->index_
                                                 )) {
                                                plVar7 = (logic_error *)
                                                         __cxa_allocate_exception(0x10);
                                                std::runtime_error::runtime_error
                                                          ((runtime_error *)plVar7,
                                                           "Assertion failed.");
                                                pcVar8 = std::runtime_error::~runtime_error;
                                                puVar12 = &std::runtime_error::typeinfo;
LAB_001c6e91:
                                                __cxa_throw(plVar7,puVar12,pcVar8);
                                              }
                                              if (*pIVar5->pointer_ != 0x2e) {
                                                plVar7 = (logic_error *)
                                                         __cxa_allocate_exception(0x10);
                                                std::logic_error::logic_error(plVar7,"test failed.")
                                                ;
                                                pcVar8 = std::logic_error::~logic_error;
                                                puVar12 = &std::logic_error::typeinfo;
                                                goto LAB_001c6e91;
                                              }
                                              if (local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                operator_delete(local_228.coordinates_.
                                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_228.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_228.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                              }
                                              operator_delete(local_1b8,local_1a0 * 0x18);
                                              operator_delete(_Var3._M_current,8);
                                              _Var3._M_current = (unsigned_long *)operator_new(8);
                                              *_Var3._M_current = 0x18;
                                              local_1c8._0_8_ = this;
                                              andres::marray_detail::
                                              Geometry<std::allocator<unsigned_long>>::
                                              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                        ((Geometry<std::allocator<unsigned_long>> *)
                                                         (local_1c8 + 8),_Var3,
                                                         (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var3._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_228
                                                  );
                                              andres::
                                              View<int,_false,_std::allocator<unsigned_long>_>::
                                              testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8);
                                              local_228.coordinates_.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_finish =
                                                   (pointer)0x0;
                                              local_228.coordinates_.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                                   (pointer)0x0;
                                              local_228.index_ = 0;
                                              local_228.coordinates_.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_start =
                                                   (pointer)0x0;
                                              local_228.view_ = (view_pointer)0x0;
                                              local_228.pointer_ = (pointer)0x0;
                                              andres::
                                              Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                              testInvariant((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_228);
                                              andres::
                                              View<int,_false,_std::allocator<unsigned_long>_>::
                                              testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8);
                                              andres::
                                              Iterator<int,_false,_std::allocator<unsigned_long>_>::
                                              Iterator(&local_188,
                                                       (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8,0);
                                              local_1f8.view_ = local_188.view_;
                                              local_1f8.pointer_ = local_188.pointer_;
                                              local_1f8.index_ = local_188.index_;
                                              std::
                                              vector<unsigned_long,_std::allocator<unsigned_long>_>
                                              ::vector(&local_1f8.coordinates_,
                                                       &local_188.coordinates_);
                                              andres::
                                              Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                              testInvariant((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_1f8);
                                              puVar2 = local_228.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              ;
                                              puVar1 = local_228.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                              local_228.index_ = local_1f8.index_;
                                              local_228.view_ = local_1f8.view_;
                                              local_228.pointer_ = local_1f8.pointer_;
                                              local_228.coordinates_.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_start =
                                                   local_1f8.coordinates_.
                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                              local_228.coordinates_.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_finish =
                                                   local_1f8.coordinates_.
                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                              local_228.coordinates_.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                                   local_1f8.coordinates_.
                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              ;
                                              local_1f8.coordinates_.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_start =
                                                   (pointer)0x0;
                                              local_1f8.coordinates_.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_finish =
                                                   (pointer)0x0;
                                              local_1f8.coordinates_.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                                   (pointer)0x0;
                                              if (puVar1 != (pointer)0x0) {
                                                operator_delete(puVar1,(long)puVar2 - (long)puVar1);
                                                if (local_1f8.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                  operator_delete(local_1f8.coordinates_.
                                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                }
                                              }
                                              if (local_188.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                operator_delete(local_188.coordinates_.
                                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_188.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_188.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                              }
                                              lVar10 = 0;
                                              do {
                                                if ((local_228.view_ == (view_pointer)0x0) ||
                                                   (((local_228.view_)->geometry_).size_ <=
                                                    local_228.index_)) {
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar7,
                                                             "Assertion failed.");
                                                  pcVar8 = std::runtime_error::~runtime_error;
                                                  puVar12 = &std::runtime_error::typeinfo;
LAB_001c63ad:
                                                  __cxa_throw(plVar7,puVar12,pcVar8);
                                                }
                                                if (*local_228.pointer_ != this->data_[lVar10]) {
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar7,"test failed.");
                                                  pcVar8 = std::logic_error::~logic_error;
                                                  puVar12 = &std::logic_error::typeinfo;
                                                  goto LAB_001c63ad;
                                                }
                                                andres::
                                                Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                ::operator++((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_228);
                                                lVar10 = lVar10 + 1;
                                              } while (lVar10 != 0x18);
                                              andres::
                                              View<int,_false,_std::allocator<unsigned_long>_>::
                                              testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8);
                                              andres::
                                              Iterator<int,_false,_std::allocator<unsigned_long>_>::
                                              Iterator(&local_1f8,
                                                       (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8,local_198);
                                              if (local_228.view_ == (view_pointer)0x0) {
                                                plVar7 = (logic_error *)
                                                         __cxa_allocate_exception(0x10);
                                                std::runtime_error::runtime_error
                                                          ((runtime_error *)plVar7,
                                                           "Assertion failed.");
                                              }
                                              else {
                                                if (local_1f8.view_ == local_228.view_) {
                                                  if (local_228.index_ != local_1f8.index_) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar7,"test failed.");
                                                    pcVar8 = std::logic_error::~logic_error;
                                                    puVar12 = &std::logic_error::typeinfo;
                                                    goto LAB_001c6f0d;
                                                  }
                                                  if (local_1f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  pIVar5 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_228);
                                                  if ((pIVar5->view_ == (view_pointer)0x0) ||
                                                     ((pIVar5->view_->geometry_).size_ <=
                                                      pIVar5->index_)) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                    pcVar8 = std::runtime_error::~runtime_error;
                                                    puVar12 = &std::runtime_error::typeinfo;
LAB_001c6f3f:
                                                    __cxa_throw(plVar7,puVar12,pcVar8);
                                                  }
                                                  if (*pIVar5->pointer_ != 0x2e) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar7,"test failed.");
                                                    pcVar8 = std::logic_error::~logic_error;
                                                    puVar12 = &std::logic_error::typeinfo;
                                                    goto LAB_001c6f3f;
                                                  }
                                                  if (local_228.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_228.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_228.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_228.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_1b8,local_1a0 * 0x18);
                                                  operator_delete(_Var3._M_current,8);
                                                  _Var3._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var3._M_current = 0x18;
                                                  local_1c8._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_1c8 + 8),_Var3,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var3._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_228
                                                  );
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8);
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_228.index_ = 0;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_228.view_ = (view_pointer)0x0;
                                                  local_228.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_228);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1f8,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8,local_198);
                                                  local_228.index_ = local_1f8.index_;
                                                  local_228.view_ = local_1f8.view_;
                                                  local_228.pointer_ = local_1f8.pointer_;
                                                  std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::operator=(&local_228.coordinates_,
                                                              &local_1f8.coordinates_);
                                                  if (local_1f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  uVar11 = 0x17;
                                                  do {
                                                    andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_228);
                                                  if ((local_228.view_ == (view_pointer)0x0) ||
                                                     (((local_228.view_)->geometry_).size_ <=
                                                      local_228.index_)) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                    pcVar8 = std::runtime_error::~runtime_error;
                                                    puVar12 = &std::runtime_error::typeinfo;
LAB_001c63df:
                                                    __cxa_throw(plVar7,puVar12,pcVar8);
                                                  }
                                                  iVar9 = (int)uVar11;
                                                  if (*local_228.pointer_ != this->data_[uVar11]) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar7,"test failed.");
                                                    pcVar8 = std::logic_error::~logic_error;
                                                    puVar12 = &std::logic_error::typeinfo;
                                                    goto LAB_001c63df;
                                                  }
                                                  uVar11 = (ulong)(iVar9 - 1);
                                                  } while (iVar9 != 0);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1f8,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8,0);
                                                  if (local_228.view_ == (view_pointer)0x0) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_1f8.view_ == local_228.view_) {
                                                      if (local_228.index_ != local_1f8.index_) {
                                                        plVar7 = (logic_error *)
                                                                 __cxa_allocate_exception(0x10);
                                                        std::logic_error::logic_error
                                                                  (plVar7,"test failed.");
                                                        pcVar8 = std::logic_error::~logic_error;
                                                        puVar12 = &std::logic_error::typeinfo;
                                                        goto LAB_001c6fbb;
                                                      }
                                                      if (local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start ==
                                                  (pointer)0x0) {
LAB_001c4ccf:
                                                    if (local_228.index_ <
                                                        ((local_228.view_)->geometry_).size_) {
                                                      if (*local_228.pointer_ != 0) {
                                                        plVar7 = (logic_error *)
                                                                 __cxa_allocate_exception(0x10);
                                                        std::logic_error::logic_error
                                                                  (plVar7,"test failed.");
                                                        pcVar8 = std::logic_error::~logic_error;
                                                        puVar12 = &std::logic_error::typeinfo;
                                                        goto LAB_001c6fed;
                                                      }
                                                      if (local_228.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_228.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_228.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_228.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_1b8,local_1a0 * 0x18);
                                                  operator_delete(_Var3._M_current,8);
                                                  _Var3._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var3._M_current = 0x18;
                                                  local_1c8._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_1c8 + 8),_Var3,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var3._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_228
                                                  );
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8);
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_228.index_ = 0;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_228.view_ = (view_pointer)0x0;
                                                  local_228.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_228);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_1f8,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_1c8,local_198);
                                                  puVar2 = local_228.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar1 = local_228.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_228.index_ = local_1f8.index_;
                                                  local_228.view_ = local_1f8.view_;
                                                  local_228.pointer_ = local_1f8.pointer_;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1f8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1f8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1f8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar1 != (pointer)0x0) {
                                                    operator_delete(puVar1,(long)puVar2 -
                                                                           (long)puVar1);
                                                    if (local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  }
                                                  uVar11 = 0x17;
                                                  do {
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_228);
                                                  if ((local_228.view_ == (view_pointer)0x0) ||
                                                     (((local_228.view_)->geometry_).size_ <=
                                                      local_228.index_)) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                    pcVar8 = std::runtime_error::~runtime_error;
                                                    puVar12 = &std::runtime_error::typeinfo;
LAB_001c6411:
                                                    __cxa_throw(plVar7,puVar12,pcVar8);
                                                  }
                                                  iVar9 = (int)uVar11;
                                                  if (*local_228.pointer_ != this->data_[uVar11]) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar7,"test failed.");
                                                    pcVar8 = std::logic_error::~logic_error;
                                                    puVar12 = &std::logic_error::typeinfo;
                                                    goto LAB_001c6411;
                                                  }
                                                  uVar11 = (ulong)(iVar9 - 1);
                                                  } while (iVar9 != 0);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_1f8,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_1c8,0);
                                                  if (local_228.view_ == (view_pointer)0x0) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_1f8.view_ == local_228.view_) {
                                                      if (local_228.index_ != local_1f8.index_) {
                                                        plVar7 = (logic_error *)
                                                                 __cxa_allocate_exception(0x10);
                                                        std::logic_error::logic_error
                                                                  (plVar7,"test failed.");
                                                        pcVar8 = std::logic_error::~logic_error;
                                                        puVar12 = &std::logic_error::typeinfo;
                                                        goto LAB_001c7069;
                                                      }
                                                      if (local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start ==
                                                  (pointer)0x0) {
LAB_001c4eaf:
                                                    if (local_228.index_ <
                                                        ((local_228.view_)->geometry_).size_) {
                                                      if (*local_228.pointer_ != 0) {
                                                        plVar7 = (logic_error *)
                                                                 __cxa_allocate_exception(0x10);
                                                        std::logic_error::logic_error
                                                                  (plVar7,"test failed.");
                                                        pcVar8 = std::logic_error::~logic_error;
                                                        puVar12 = &std::logic_error::typeinfo;
                                                        goto LAB_001c709b;
                                                      }
                                                      if (local_228.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_228.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_228.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_228.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_1b8,local_1a0 * 0x18);
                                                  operator_delete(_Var3._M_current,8);
                                                  _Var3._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var3._M_current = 0x18;
                                                  local_1c8._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_1c8 + 8),_Var3,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var3._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_228
                                                  );
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8);
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_228.index_ = 0;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_228.view_ = (view_pointer)0x0;
                                                  local_228.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_228);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_188,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8,local_198);
                                                  local_1f8.view_ = local_188.view_;
                                                  local_1f8.pointer_ = local_188.pointer_;
                                                  local_1f8.index_ = local_188.index_;
                                                  std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::vector(&local_1f8.coordinates_,
                                                           &local_188.coordinates_);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_1f8);
                                                  puVar2 = local_228.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar1 = local_228.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_228.index_ = local_1f8.index_;
                                                  local_228.view_ = local_1f8.view_;
                                                  local_228.pointer_ = local_1f8.pointer_;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1f8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1f8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1f8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar1 != (pointer)0x0) {
                                                    operator_delete(puVar1,(long)puVar2 -
                                                                           (long)puVar1);
                                                    if (local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  }
                                                  if (local_188.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_188.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_188.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_188.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  uVar11 = 0x17;
                                                  do {
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_228);
                                                  if ((local_228.view_ == (view_pointer)0x0) ||
                                                     (((local_228.view_)->geometry_).size_ <=
                                                      local_228.index_)) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                    pcVar8 = std::runtime_error::~runtime_error;
                                                    puVar12 = &std::runtime_error::typeinfo;
LAB_001c6443:
                                                    __cxa_throw(plVar7,puVar12,pcVar8);
                                                  }
                                                  iVar9 = (int)uVar11;
                                                  if (*local_228.pointer_ != this->data_[uVar11]) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar7,"test failed.");
                                                    pcVar8 = std::logic_error::~logic_error;
                                                    puVar12 = &std::logic_error::typeinfo;
                                                    goto LAB_001c6443;
                                                  }
                                                  uVar11 = (ulong)(iVar9 - 1);
                                                  } while (iVar9 != 0);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1f8,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8,0);
                                                  if (local_228.view_ == (view_pointer)0x0) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_1f8.view_ == local_228.view_) {
                                                      if (local_228.index_ != local_1f8.index_) {
                                                        plVar7 = (logic_error *)
                                                                 __cxa_allocate_exception(0x10);
                                                        std::logic_error::logic_error
                                                                  (plVar7,"test failed.");
                                                        pcVar8 = std::logic_error::~logic_error;
                                                        puVar12 = &std::logic_error::typeinfo;
                                                        goto LAB_001c7117;
                                                      }
                                                      if (local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start ==
                                                  (pointer)0x0) {
LAB_001c50d9:
                                                    if (local_228.index_ <
                                                        ((local_228.view_)->geometry_).size_) {
                                                      if (*local_228.pointer_ != 0) {
                                                        plVar7 = (logic_error *)
                                                                 __cxa_allocate_exception(0x10);
                                                        std::logic_error::logic_error
                                                                  (plVar7,"test failed.");
                                                        pcVar8 = std::logic_error::~logic_error;
                                                        puVar12 = &std::logic_error::typeinfo;
                                                        goto LAB_001c7149;
                                                      }
                                                      if (local_228.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_228.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_228.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_228.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_1b8,local_1a0 * 0x18);
                                                  operator_delete(_Var3._M_current,8);
                                                  _Var3._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var3._M_current = 0x18;
                                                  local_1c8._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_1c8 + 8),_Var3,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var3._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_228
                                                  );
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8);
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_228.index_ = 0;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_228.view_ = (view_pointer)0x0;
                                                  local_228.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_228);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1f8,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8,0);
                                                  local_228.index_ = local_1f8.index_;
                                                  local_228.view_ = local_1f8.view_;
                                                  local_228.pointer_ = local_1f8.pointer_;
                                                  std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::operator=(&local_228.coordinates_,
                                                              &local_1f8.coordinates_);
                                                  if (local_1f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  lVar10 = 0;
                                                  do {
                                                    if ((local_228.view_ == (view_pointer)0x0) ||
                                                       (((local_228.view_)->geometry_).size_ <=
                                                        local_228.index_)) {
                                                      plVar7 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar7,
                                                                 "Assertion failed.");
                                                      pcVar8 = std::runtime_error::~runtime_error;
                                                      puVar12 = &std::runtime_error::typeinfo;
LAB_001c6475:
                                                      __cxa_throw(plVar7,puVar12,pcVar8);
                                                    }
                                                    if (*local_228.pointer_ != this->data_[lVar10])
                                                    {
                                                      plVar7 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar7,"test failed.");
                                                      pcVar8 = std::logic_error::~logic_error;
                                                      puVar12 = &std::logic_error::typeinfo;
                                                      goto LAB_001c6475;
                                                    }
                                                    andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_60,&local_228,0);
                                                  if (local_60.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_60.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_60.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_60.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  lVar10 = lVar10 + 1;
                                                  } while (lVar10 != 0x18);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1f8,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8,local_198);
                                                  if (local_228.view_ == (view_pointer)0x0) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_1f8.view_ == local_228.view_) {
                                                      if (local_228.index_ != local_1f8.index_) {
                                                        plVar7 = (logic_error *)
                                                                 __cxa_allocate_exception(0x10);
                                                        std::logic_error::logic_error
                                                                  (plVar7,"test failed.");
                                                        pcVar8 = std::logic_error::~logic_error;
                                                        puVar12 = &std::logic_error::typeinfo;
                                                        goto LAB_001c71c5;
                                                      }
                                                      if (local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  pIVar4 = andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_228);
                                                  if ((pIVar4->view_ == (view_pointer)0x0) ||
                                                     ((pIVar4->view_->geometry_).size_ <=
                                                      pIVar4->index_)) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                    pcVar8 = std::runtime_error::~runtime_error;
                                                    puVar12 = &std::runtime_error::typeinfo;
LAB_001c71f7:
                                                    __cxa_throw(plVar7,puVar12,pcVar8);
                                                  }
                                                  if (*pIVar4->pointer_ != 0x2e) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar7,"test failed.");
                                                    pcVar8 = std::logic_error::~logic_error;
                                                    puVar12 = &std::logic_error::typeinfo;
                                                    goto LAB_001c71f7;
                                                  }
                                                  if (local_228.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_228.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_228.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_228.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_1b8,local_1a0 * 0x18);
                                                  operator_delete(_Var3._M_current,8);
                                                  _Var3._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var3._M_current = 0x18;
                                                  local_1c8._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_1c8 + 8),_Var3,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var3._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_228
                                                  );
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8);
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_228.index_ = 0;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_228.view_ = (view_pointer)0x0;
                                                  local_228.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_228);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_1f8,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_1c8,0);
                                                  puVar2 = local_228.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar1 = local_228.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_228.index_ = local_1f8.index_;
                                                  local_228.view_ = local_1f8.view_;
                                                  local_228.pointer_ = local_1f8.pointer_;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1f8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1f8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1f8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar1 != (pointer)0x0) {
                                                    operator_delete(puVar1,(long)puVar2 -
                                                                           (long)puVar1);
                                                    if (local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  }
                                                  lVar10 = 0;
                                                  do {
                                                    if ((local_228.view_ == (view_pointer)0x0) ||
                                                       (((local_228.view_)->geometry_).size_ <=
                                                        local_228.index_)) {
                                                      plVar7 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar7,
                                                                 "Assertion failed.");
                                                      pcVar8 = std::runtime_error::~runtime_error;
                                                      puVar12 = &std::runtime_error::typeinfo;
LAB_001c64a7:
                                                      __cxa_throw(plVar7,puVar12,pcVar8);
                                                    }
                                                    if (*local_228.pointer_ != this->data_[lVar10])
                                                    {
                                                      plVar7 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar7,"test failed.");
                                                      pcVar8 = std::logic_error::~logic_error;
                                                      puVar12 = &std::logic_error::typeinfo;
                                                      goto LAB_001c64a7;
                                                    }
                                                    local_b8 = local_228.index_;
                                                    local_c8 = local_228.view_;
                                                    piStack_c0 = local_228.pointer_;
                                                    std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::vector(&local_b0,&local_228.coordinates_);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_228);
                                                  if (local_b0.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_b0.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_b0.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_b0.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  lVar10 = lVar10 + 1;
                                                  } while (lVar10 != 0x18);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_1f8,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_1c8,local_198);
                                                  if (local_228.view_ == (view_pointer)0x0) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_1f8.view_ == local_228.view_) {
                                                      if (local_228.index_ != local_1f8.index_) {
                                                        plVar7 = (logic_error *)
                                                                 __cxa_allocate_exception(0x10);
                                                        std::logic_error::logic_error
                                                                  (plVar7,"test failed.");
                                                        pcVar8 = std::logic_error::~logic_error;
                                                        puVar12 = &std::logic_error::typeinfo;
                                                        goto LAB_001c7273;
                                                      }
                                                      if (local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  pIVar5 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_228);
                                                  if ((pIVar5->view_ == (view_pointer)0x0) ||
                                                     ((pIVar5->view_->geometry_).size_ <=
                                                      pIVar5->index_)) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                    pcVar8 = std::runtime_error::~runtime_error;
                                                    puVar12 = &std::runtime_error::typeinfo;
LAB_001c72a5:
                                                    __cxa_throw(plVar7,puVar12,pcVar8);
                                                  }
                                                  if (*pIVar5->pointer_ != 0x2e) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar7,"test failed.");
                                                    pcVar8 = std::logic_error::~logic_error;
                                                    puVar12 = &std::logic_error::typeinfo;
                                                    goto LAB_001c72a5;
                                                  }
                                                  if (local_228.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_228.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_228.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_228.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_1b8,local_1a0 * 0x18);
                                                  operator_delete(_Var3._M_current,8);
                                                  _Var3._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var3._M_current = 0x18;
                                                  local_1c8._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_1c8 + 8),_Var3,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var3._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_228
                                                  );
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8);
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_228.index_ = 0;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_228.view_ = (view_pointer)0x0;
                                                  local_228.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_228);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_188,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8,0);
                                                  local_1f8.view_ = local_188.view_;
                                                  local_1f8.pointer_ = local_188.pointer_;
                                                  local_1f8.index_ = local_188.index_;
                                                  std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::vector(&local_1f8.coordinates_,
                                                           &local_188.coordinates_);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_1f8);
                                                  puVar2 = local_228.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar1 = local_228.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_228.index_ = local_1f8.index_;
                                                  local_228.view_ = local_1f8.view_;
                                                  local_228.pointer_ = local_1f8.pointer_;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1f8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1f8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1f8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar1 != (pointer)0x0) {
                                                    operator_delete(puVar1,(long)puVar2 -
                                                                           (long)puVar1);
                                                    if (local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  }
                                                  if (local_188.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_188.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_188.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_188.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  lVar10 = 0;
                                                  do {
                                                    if ((local_228.view_ == (view_pointer)0x0) ||
                                                       (((local_228.view_)->geometry_).size_ <=
                                                        local_228.index_)) {
                                                      plVar7 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar7,
                                                                 "Assertion failed.");
                                                      pcVar8 = std::runtime_error::~runtime_error;
                                                      puVar12 = &std::runtime_error::typeinfo;
LAB_001c64d9:
                                                      __cxa_throw(plVar7,puVar12,pcVar8);
                                                    }
                                                    if (*local_228.pointer_ != this->data_[lVar10])
                                                    {
                                                      plVar7 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar7,"test failed.");
                                                      pcVar8 = std::logic_error::~logic_error;
                                                      puVar12 = &std::logic_error::typeinfo;
                                                      goto LAB_001c64d9;
                                                    }
                                                    local_e8 = local_228.index_;
                                                    local_f8 = local_228.view_;
                                                    piStack_f0 = local_228.pointer_;
                                                    std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::vector(&local_e0,&local_228.coordinates_);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_228);
                                                  if (local_e0.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_e0.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_e0.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_e0.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  lVar10 = lVar10 + 1;
                                                  } while (lVar10 != 0x18);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1f8,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8,local_198);
                                                  if (local_228.view_ == (view_pointer)0x0) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_1f8.view_ == local_228.view_) {
                                                      if (local_228.index_ != local_1f8.index_) {
                                                        plVar7 = (logic_error *)
                                                                 __cxa_allocate_exception(0x10);
                                                        std::logic_error::logic_error
                                                                  (plVar7,"test failed.");
                                                        pcVar8 = std::logic_error::~logic_error;
                                                        puVar12 = &std::logic_error::typeinfo;
                                                        goto LAB_001c7321;
                                                      }
                                                      if (local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  pIVar5 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_228);
                                                  if ((pIVar5->view_ == (view_pointer)0x0) ||
                                                     ((pIVar5->view_->geometry_).size_ <=
                                                      pIVar5->index_)) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                    pcVar8 = std::runtime_error::~runtime_error;
                                                    puVar12 = &std::runtime_error::typeinfo;
LAB_001c7353:
                                                    __cxa_throw(plVar7,puVar12,pcVar8);
                                                  }
                                                  if (*pIVar5->pointer_ != 0x2e) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar7,"test failed.");
                                                    pcVar8 = std::logic_error::~logic_error;
                                                    puVar12 = &std::logic_error::typeinfo;
                                                    goto LAB_001c7353;
                                                  }
                                                  if (local_228.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_228.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_228.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_228.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_1b8,local_1a0 * 0x18);
                                                  operator_delete(_Var3._M_current,8);
                                                  _Var3._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var3._M_current = 0x18;
                                                  local_1c8._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_1c8 + 8),_Var3,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var3._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_228
                                                  );
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8);
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_228.index_ = 0;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_228.view_ = (view_pointer)0x0;
                                                  local_228.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_228);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1f8,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8,local_198);
                                                  local_228.index_ = local_1f8.index_;
                                                  local_228.view_ = local_1f8.view_;
                                                  local_228.pointer_ = local_1f8.pointer_;
                                                  std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::operator=(&local_228.coordinates_,
                                                              &local_1f8.coordinates_);
                                                  if (local_1f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  uVar11 = 0x17;
                                                  do {
                                                    andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_90,&local_228,0);
                                                  if (local_90.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_90.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_90.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_90.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if ((local_228.view_ == (view_pointer)0x0) ||
                                                     (((local_228.view_)->geometry_).size_ <=
                                                      local_228.index_)) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                    pcVar8 = std::runtime_error::~runtime_error;
                                                    puVar12 = &std::runtime_error::typeinfo;
LAB_001c650b:
                                                    __cxa_throw(plVar7,puVar12,pcVar8);
                                                  }
                                                  iVar9 = (int)uVar11;
                                                  if (*local_228.pointer_ != this->data_[uVar11]) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar7,"test failed.");
                                                    pcVar8 = std::logic_error::~logic_error;
                                                    puVar12 = &std::logic_error::typeinfo;
                                                    goto LAB_001c650b;
                                                  }
                                                  uVar11 = (ulong)(iVar9 - 1);
                                                  } while (iVar9 != 0);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1f8,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8,0);
                                                  if (local_228.view_ == (view_pointer)0x0) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_1f8.view_ == local_228.view_) {
                                                      if (local_228.index_ != local_1f8.index_) {
                                                        plVar7 = (logic_error *)
                                                                 __cxa_allocate_exception(0x10);
                                                        std::logic_error::logic_error
                                                                  (plVar7,"test failed.");
                                                        pcVar8 = std::logic_error::~logic_error;
                                                        puVar12 = &std::logic_error::typeinfo;
                                                        goto LAB_001c73cf;
                                                      }
                                                      if (local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start ==
                                                  (pointer)0x0) {
LAB_001c5940:
                                                    if (local_228.index_ <
                                                        ((local_228.view_)->geometry_).size_) {
                                                      if (*local_228.pointer_ != 0) {
                                                        plVar7 = (logic_error *)
                                                                 __cxa_allocate_exception(0x10);
                                                        std::logic_error::logic_error
                                                                  (plVar7,"test failed.");
                                                        pcVar8 = std::logic_error::~logic_error;
                                                        puVar12 = &std::logic_error::typeinfo;
                                                        goto LAB_001c7401;
                                                      }
                                                      if (local_228.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_228.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_228.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_228.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_1b8,local_1a0 * 0x18);
                                                  operator_delete(_Var3._M_current,8);
                                                  _Var3._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var3._M_current = 0x18;
                                                  local_1c8._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_1c8 + 8),_Var3,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var3._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_228
                                                  );
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8);
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_228.index_ = 0;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_228.view_ = (view_pointer)0x0;
                                                  local_228.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_228);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_1f8,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_1c8,local_198);
                                                  puVar2 = local_228.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar1 = local_228.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_228.index_ = local_1f8.index_;
                                                  local_228.view_ = local_1f8.view_;
                                                  local_228.pointer_ = local_1f8.pointer_;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1f8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1f8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1f8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar1 != (pointer)0x0) {
                                                    operator_delete(puVar1,(long)puVar2 -
                                                                           (long)puVar1);
                                                    if (local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  }
                                                  bVar13 = local_228.view_ != (view_pointer)0x0;
                                                  uVar11 = 0x17;
                                                  do {
                                                    if ((!bVar13) || (local_228.index_ == 0)) {
                                                      prVar6 = (runtime_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                (prVar6,"Assertion failed.");
                                                      __cxa_throw(prVar6,&std::runtime_error::
                                                                          typeinfo,
                                                                  std::runtime_error::~runtime_error
                                                                 );
                                                    }
                                                    local_118 = local_228.index_;
                                                    local_128 = local_228.view_;
                                                    piStack_120 = local_228.pointer_;
                                                    std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::vector(&local_110,&local_228.coordinates_);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_228);
                                                  if (local_110.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_110.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_110.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_110.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if ((local_228.view_ == (view_pointer)0x0) ||
                                                     (((local_228.view_)->geometry_).size_ <=
                                                      local_228.index_)) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                    pcVar8 = std::runtime_error::~runtime_error;
                                                    puVar12 = &std::runtime_error::typeinfo;
LAB_001c653d:
                                                    __cxa_throw(plVar7,puVar12,pcVar8);
                                                  }
                                                  iVar9 = (int)uVar11;
                                                  if (*local_228.pointer_ != this->data_[uVar11]) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar7,"test failed.");
                                                    pcVar8 = std::logic_error::~logic_error;
                                                    puVar12 = &std::logic_error::typeinfo;
                                                    goto LAB_001c653d;
                                                  }
                                                  bVar13 = true;
                                                  uVar11 = (ulong)(iVar9 - 1);
                                                  } while (iVar9 != 0);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_1f8,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_1c8,0);
                                                  if (local_228.view_ == (view_pointer)0x0) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_1f8.view_ == local_228.view_) {
                                                      if (local_228.index_ != local_1f8.index_) {
                                                        plVar7 = (logic_error *)
                                                                 __cxa_allocate_exception(0x10);
                                                        std::logic_error::logic_error
                                                                  (plVar7,"test failed.");
                                                        pcVar8 = std::logic_error::~logic_error;
                                                        puVar12 = &std::logic_error::typeinfo;
                                                        goto LAB_001c747d;
                                                      }
                                                      if (local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start ==
                                                  (pointer)0x0) {
LAB_001c5b9c:
                                                    if (local_228.index_ <
                                                        ((local_228.view_)->geometry_).size_) {
                                                      if (*local_228.pointer_ != 0) {
                                                        plVar7 = (logic_error *)
                                                                 __cxa_allocate_exception(0x10);
                                                        std::logic_error::logic_error
                                                                  (plVar7,"test failed.");
                                                        pcVar8 = std::logic_error::~logic_error;
                                                        puVar12 = &std::logic_error::typeinfo;
                                                        goto LAB_001c74af;
                                                      }
                                                      if (local_228.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_228.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_228.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_228.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_1b8,local_1a0 * 0x18);
                                                  operator_delete(_Var3._M_current,8);
                                                  _Var3._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var3._M_current = 0x18;
                                                  local_1c8._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_1c8 + 8),_Var3,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var3._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_228
                                                  );
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8);
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_228.index_ = 0;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_228.view_ = (view_pointer)0x0;
                                                  local_228.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_228);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_188,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8,local_198);
                                                  local_1f8.view_ = local_188.view_;
                                                  local_1f8.pointer_ = local_188.pointer_;
                                                  local_1f8.index_ = local_188.index_;
                                                  std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::vector(&local_1f8.coordinates_,
                                                           &local_188.coordinates_);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_1f8);
                                                  puVar2 = local_228.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar1 = local_228.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_228.index_ = local_1f8.index_;
                                                  local_228.view_ = local_1f8.view_;
                                                  local_228.pointer_ = local_1f8.pointer_;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1f8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1f8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1f8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar1 != (pointer)0x0) {
                                                    operator_delete(puVar1,(long)puVar2 -
                                                                           (long)puVar1);
                                                    if (local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  }
                                                  if (local_188.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_188.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_188.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_188.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  bVar13 = local_228.view_ != (view_pointer)0x0;
                                                  uVar11 = 0x17;
                                                  do {
                                                    if ((!bVar13) || (local_228.index_ == 0)) {
                                                      prVar6 = (runtime_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                (prVar6,"Assertion failed.");
                                                      __cxa_throw(prVar6,&std::runtime_error::
                                                                          typeinfo,
                                                                  std::runtime_error::~runtime_error
                                                                 );
                                                    }
                                                    local_148 = local_228.index_;
                                                    local_158 = local_228.view_;
                                                    piStack_150 = local_228.pointer_;
                                                    std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::vector(&local_140,&local_228.coordinates_);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_228);
                                                  if (local_140.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_140.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_140.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_140.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if ((local_228.view_ == (view_pointer)0x0) ||
                                                     (((local_228.view_)->geometry_).size_ <=
                                                      local_228.index_)) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                    pcVar8 = std::runtime_error::~runtime_error;
                                                    puVar12 = &std::runtime_error::typeinfo;
LAB_001c65a1:
                                                    __cxa_throw(plVar7,puVar12,pcVar8);
                                                  }
                                                  iVar9 = (int)uVar11;
                                                  if (*local_228.pointer_ != this->data_[uVar11]) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar7,"test failed.");
                                                    pcVar8 = std::logic_error::~logic_error;
                                                    puVar12 = &std::logic_error::typeinfo;
                                                    goto LAB_001c65a1;
                                                  }
                                                  bVar13 = true;
                                                  uVar11 = (ulong)(iVar9 - 1);
                                                  } while (iVar9 != 0);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1f8,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8,0);
                                                  if (local_228.view_ == (view_pointer)0x0) {
                                                    plVar7 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar7,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_1f8.view_ == local_228.view_) {
                                                      if (local_228.index_ != local_1f8.index_) {
                                                        plVar7 = (logic_error *)
                                                                 __cxa_allocate_exception(0x10);
                                                        std::logic_error::logic_error
                                                                  (plVar7,"test failed.");
                                                        pcVar8 = std::logic_error::~logic_error;
                                                        puVar12 = &std::logic_error::typeinfo;
                                                        goto LAB_001c752b;
                                                      }
                                                      if (local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start ==
                                                  (pointer)0x0) {
LAB_001c5e38:
                                                    if (local_228.index_ <
                                                        ((local_228.view_)->geometry_).size_) {
                                                      if (*local_228.pointer_ == 0) {
                                                        if (local_228.coordinates_.
                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_228.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_228.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_228.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_1b8,local_1a0 * 0x18);
                                                  operator_delete(_Var3._M_current,8);
                                                  return;
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar7,"test failed.");
                                                  pcVar8 = std::logic_error::~logic_error;
                                                  puVar12 = &std::logic_error::typeinfo;
                                                  goto LAB_001c755d;
                                                  }
                                                  }
                                                  else {
                                                    operator_delete(local_1f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  if (local_228.view_ != (view_pointer)0x0)
                                                  goto LAB_001c5e38;
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar7,
                                                             "Assertion failed.");
                                                  pcVar8 = std::runtime_error::~runtime_error;
                                                  puVar12 = &std::runtime_error::typeinfo;
LAB_001c755d:
                                                  __cxa_throw(plVar7,puVar12,pcVar8);
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar7,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar8 = std::runtime_error::~runtime_error;
                                                  puVar12 = &std::runtime_error::typeinfo;
LAB_001c752b:
                                                  __cxa_throw(plVar7,puVar12,pcVar8);
                                                  }
                                                  }
                                                  else {
                                                    operator_delete(local_1f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  if (local_228.view_ != (view_pointer)0x0)
                                                  goto LAB_001c5b9c;
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar7,
                                                             "Assertion failed.");
                                                  pcVar8 = std::runtime_error::~runtime_error;
                                                  puVar12 = &std::runtime_error::typeinfo;
LAB_001c74af:
                                                  __cxa_throw(plVar7,puVar12,pcVar8);
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar7,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar8 = std::runtime_error::~runtime_error;
                                                  puVar12 = &std::runtime_error::typeinfo;
LAB_001c747d:
                                                  __cxa_throw(plVar7,puVar12,pcVar8);
                                                  }
                                                  }
                                                  else {
                                                    operator_delete(local_1f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  if (local_228.view_ != (view_pointer)0x0)
                                                  goto LAB_001c5940;
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar7,
                                                             "Assertion failed.");
                                                  pcVar8 = std::runtime_error::~runtime_error;
                                                  puVar12 = &std::runtime_error::typeinfo;
LAB_001c7401:
                                                  __cxa_throw(plVar7,puVar12,pcVar8);
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar7,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar8 = std::runtime_error::~runtime_error;
                                                  puVar12 = &std::runtime_error::typeinfo;
LAB_001c73cf:
                                                  __cxa_throw(plVar7,puVar12,pcVar8);
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar7,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar8 = std::runtime_error::~runtime_error;
                                                  puVar12 = &std::runtime_error::typeinfo;
LAB_001c7321:
                                                  __cxa_throw(plVar7,puVar12,pcVar8);
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar7,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar8 = std::runtime_error::~runtime_error;
                                                  puVar12 = &std::runtime_error::typeinfo;
LAB_001c7273:
                                                  __cxa_throw(plVar7,puVar12,pcVar8);
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar7,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar8 = std::runtime_error::~runtime_error;
                                                  puVar12 = &std::runtime_error::typeinfo;
LAB_001c71c5:
                                                  __cxa_throw(plVar7,puVar12,pcVar8);
                                                  }
                                                  }
                                                  else {
                                                    operator_delete(local_1f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  if (local_228.view_ != (view_pointer)0x0)
                                                  goto LAB_001c50d9;
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar7,
                                                             "Assertion failed.");
                                                  pcVar8 = std::runtime_error::~runtime_error;
                                                  puVar12 = &std::runtime_error::typeinfo;
LAB_001c7149:
                                                  __cxa_throw(plVar7,puVar12,pcVar8);
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar7,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar8 = std::runtime_error::~runtime_error;
                                                  puVar12 = &std::runtime_error::typeinfo;
LAB_001c7117:
                                                  __cxa_throw(plVar7,puVar12,pcVar8);
                                                  }
                                                  }
                                                  else {
                                                    operator_delete(local_1f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  if (local_228.view_ != (view_pointer)0x0)
                                                  goto LAB_001c4eaf;
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar7,
                                                             "Assertion failed.");
                                                  pcVar8 = std::runtime_error::~runtime_error;
                                                  puVar12 = &std::runtime_error::typeinfo;
LAB_001c709b:
                                                  __cxa_throw(plVar7,puVar12,pcVar8);
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar7,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar8 = std::runtime_error::~runtime_error;
                                                  puVar12 = &std::runtime_error::typeinfo;
LAB_001c7069:
                                                  __cxa_throw(plVar7,puVar12,pcVar8);
                                                  }
                                                  }
                                                  else {
                                                    operator_delete(local_1f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  if (local_228.view_ != (view_pointer)0x0)
                                                  goto LAB_001c4ccf;
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar7,
                                                             "Assertion failed.");
                                                  pcVar8 = std::runtime_error::~runtime_error;
                                                  puVar12 = &std::runtime_error::typeinfo;
LAB_001c6fed:
                                                  __cxa_throw(plVar7,puVar12,pcVar8);
                                                  }
                                                  plVar7 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar7,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar8 = std::runtime_error::~runtime_error;
                                                  puVar12 = &std::runtime_error::typeinfo;
LAB_001c6fbb:
                                                  __cxa_throw(plVar7,puVar12,pcVar8);
                                                }
                                                plVar7 = (logic_error *)
                                                         __cxa_allocate_exception(0x10);
                                                std::runtime_error::runtime_error
                                                          ((runtime_error *)plVar7,
                                                           "Assertion failed.");
                                              }
                                              pcVar8 = std::runtime_error::~runtime_error;
                                              puVar12 = &std::runtime_error::typeinfo;
LAB_001c6f0d:
                                              __cxa_throw(plVar7,puVar12,pcVar8);
                                            }
                                            plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                                            std::runtime_error::runtime_error
                                                      ((runtime_error *)plVar7,"Assertion failed.");
                                          }
                                          pcVar8 = std::runtime_error::~runtime_error;
                                          puVar12 = &std::runtime_error::typeinfo;
LAB_001c6e5f:
                                          __cxa_throw(plVar7,puVar12,pcVar8);
                                        }
                                        plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::runtime_error::runtime_error
                                                  ((runtime_error *)plVar7,"Assertion failed.");
                                      }
                                      pcVar8 = std::runtime_error::~runtime_error;
                                      puVar12 = &std::runtime_error::typeinfo;
LAB_001c6db1:
                                      __cxa_throw(plVar7,puVar12,pcVar8);
                                    }
                                  }
                                  else {
                                    operator_delete(local_1f8.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                    if (local_228.view_ != (view_pointer)0x0) goto LAB_001c4554;
                                  }
                                  plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::runtime_error::runtime_error
                                            ((runtime_error *)plVar7,"Assertion failed.");
                                  pcVar8 = std::runtime_error::~runtime_error;
                                  puVar12 = &std::runtime_error::typeinfo;
LAB_001c6d35:
                                  __cxa_throw(plVar7,puVar12,pcVar8);
                                }
                                plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                                std::runtime_error::runtime_error
                                          ((runtime_error *)plVar7,"Assertion failed.");
                              }
                              pcVar8 = std::runtime_error::~runtime_error;
                              puVar12 = &std::runtime_error::typeinfo;
LAB_001c6d03:
                              __cxa_throw(plVar7,puVar12,pcVar8);
                            }
                          }
                          else {
                            operator_delete(local_1f8.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_1f8.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                            if (local_228.view_ != (view_pointer)0x0) goto LAB_001c4319;
                          }
                          plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error
                                    ((runtime_error *)plVar7,"Assertion failed.");
                          pcVar8 = std::runtime_error::~runtime_error;
                          puVar12 = &std::runtime_error::typeinfo;
LAB_001c6c87:
                          __cxa_throw(plVar7,puVar12,pcVar8);
                        }
                        plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error
                                  ((runtime_error *)plVar7,"Assertion failed.");
                      }
                      pcVar8 = std::runtime_error::~runtime_error;
                      puVar12 = &std::runtime_error::typeinfo;
LAB_001c6c55:
                      __cxa_throw(plVar7,puVar12,pcVar8);
                    }
                  }
                  else {
                    operator_delete(local_1f8.coordinates_.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_1f8.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_1f8.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                    if (local_228.view_ != (view_pointer)0x0) goto LAB_001c4128;
                  }
                  plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error((runtime_error *)plVar7,"Assertion failed.");
                  pcVar8 = std::runtime_error::~runtime_error;
                  puVar12 = &std::runtime_error::typeinfo;
LAB_001c6bd9:
                  __cxa_throw(plVar7,puVar12,pcVar8);
                }
                plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar7,"Assertion failed.");
              }
              pcVar8 = std::runtime_error::~runtime_error;
              puVar12 = &std::runtime_error::typeinfo;
LAB_001c6ba7:
              __cxa_throw(plVar7,puVar12,pcVar8);
            }
            plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error((runtime_error *)plVar7,"Assertion failed.");
          }
          pcVar8 = std::runtime_error::~runtime_error;
          puVar12 = &std::runtime_error::typeinfo;
LAB_001c6af9:
          __cxa_throw(plVar7,puVar12,pcVar8);
        }
        plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error((runtime_error *)plVar7,"Assertion failed.");
      }
      pcVar8 = std::runtime_error::~runtime_error;
      puVar12 = &std::runtime_error::typeinfo;
LAB_001c6a4b:
      __cxa_throw(plVar7,puVar12,pcVar8);
    }
    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar7,"Assertion failed.");
  }
  pcVar8 = std::runtime_error::~runtime_error;
  puVar12 = &std::runtime_error::typeinfo;
LAB_001c699d:
  __cxa_throw(plVar7,puVar12,pcVar8);
}

Assistant:

void IteratorTest::arithmeticOperatorsTest(){
    // operator+=
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            it += 1;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            it += 1;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            it += 1;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    // operator-=
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.end();

        
        for(int i = 23; i >= 0; --i){
            it -= 1;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.end();
        
        for(int i = 23; i >= 0; --i){
            it -= 1;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.end();
        
        for(int i = 23; i >= 0; --i){
            it -= 1;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
    // operator++ prefix
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            ++it;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            ++it;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            ++it;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    // operator-- prefix
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.end();
        
        for(int i = 23; i >= 0; --i){
            --it;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.end();
        
        for(int i = 23; i >= 0; --i){
            --it;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.end();
        
        for(int i = 23; i >= 0; --i){
            --it;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
    // operator++ postfix
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            it++;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            it++;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            it++;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    // operator-- postfix
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.end();
        
        for(int i = 23; i >= 0; --i){
            it--;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.end();
        
        for(int i = 23; i >= 0; --i){
            it--;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.end();
        
        for(int i = 23; i >= 0; --i){
            it--;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
}